

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS ref_oct_split(REF_OCT ref_oct,REF_INT node)

{
  int iVar1;
  long lVar2;
  int iVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  
  if (node < 0) {
    pcVar8 = "node negative";
    uVar5 = 0xa2;
  }
  else if (node < ref_oct->n) {
    iVar1 = ref_oct->max;
    if (node < iVar1) {
      pRVar4 = ref_oct->children;
      lVar7 = 0;
      while (lVar7 != 8) {
        lVar2 = (ulong)(uint)(node << 3) + lVar7;
        lVar7 = lVar7 + 1;
        if ((long)pRVar4[lVar2] != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xa6,"ref_oct_split","child not empty",0xffffffffffffffff,(long)pRVar4[lVar2]);
          return 1;
        }
      }
      if (ref_oct->n + 8 <= iVar1) {
LAB_0017103f:
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          iVar1 = ref_oct->n;
          pRVar4[(ulong)(uint)(node << 3) + lVar7] = iVar1;
          ref_oct->n = iVar1 + 1;
        }
        return 0;
      }
      if (iVar1 < 0x4bda12f) {
        iVar3 = 0x4bda12f - iVar1;
        if ((int)((double)iVar1 * 1.5) <= 0x4bda12f - iVar1) {
          iVar3 = (int)((double)iVar1 * 1.5);
        }
        ref_oct->max = iVar3 + iVar1;
        fflush(_stdout);
        pRVar4 = ref_oct->children;
        if (0 < ref_oct->max) {
          pRVar4 = (REF_INT *)realloc(pRVar4,(ulong)(uint)(ref_oct->max << 3) << 2);
          ref_oct->children = pRVar4;
        }
        if (pRVar4 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb1,"ref_oct_split","realloc ref_oct->children NULL");
          uVar6 = (long)ref_oct->max * 8;
          lVar7 = (long)ref_oct->max << 5;
        }
        else {
          fflush(_stdout);
          if (ref_oct->max < 1) {
            pRVar4 = ref_oct->nodes;
          }
          else {
            pRVar4 = (REF_INT *)realloc(ref_oct->nodes,(ulong)(uint)ref_oct->max * 0x6c);
            ref_oct->nodes = pRVar4;
          }
          if (pRVar4 != (REF_INT *)0x0) {
            for (lVar7 = (long)(iVar1 * 8); uVar6 = (ulong)ref_oct->max,
                SBORROW8(lVar7,uVar6 * 8) != (long)(lVar7 + uVar6 * -8) < 0; lVar7 = lVar7 + 1) {
              ref_oct->children[lVar7] = -1;
            }
            for (lVar7 = (long)(iVar1 * 0x1b); lVar7 < (int)uVar6 * 0x1b; lVar7 = lVar7 + 1) {
              pRVar4[lVar7] = -1;
              uVar6 = (ulong)(uint)ref_oct->max;
            }
            pRVar4 = ref_oct->children;
            goto LAB_0017103f;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb2,"ref_oct_split","realloc ref_oct->nodes NULL");
          uVar6 = (long)ref_oct->max * 0x1b;
          lVar7 = (long)ref_oct->max * 0x6c;
        }
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar6 & 0xffffffff,uVar6,4
               ,lVar7);
        return 2;
      }
      pcVar8 = "chunk limit at max";
      uVar5 = 0xae;
    }
    else {
      pcVar8 = "node larger than max";
      uVar5 = 0xa4;
    }
  }
  else {
    pcVar8 = "node larger than n";
    uVar5 = 0xa3;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar5,
         "ref_oct_split",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_oct_split(REF_OCT ref_oct, REF_INT node) {
  REF_INT i;
  RAS(node >= 0, "node negative");
  RAS(node < ref_oct_n(ref_oct), "node larger than n");
  RAS(node < ref_oct_max(ref_oct), "node larger than max");
  for (i = 0; i < 8; i++) {
    REIS(REF_EMPTY, ref_oct_child(ref_oct, i, node), "child not empty");
  }
  if (ref_oct_n(ref_oct) + 8 > ref_oct_max(ref_oct)) {
    REF_INT orig, chunk;
    REF_INT max_limit = REF_INT_MAX / 27;
    orig = ref_oct_max(ref_oct);
    /* geometric growth for efficiency */
    chunk = (REF_INT)(1.5 * (REF_DBL)orig);
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);
    ref_oct_max(ref_oct) = orig + chunk;
    ref_realloc(ref_oct->children, 8 * ref_oct->max, REF_INT);
    ref_realloc(ref_oct->nodes, 27 * ref_oct->max, REF_INT);
    for (i = 8 * orig; i < 8 * ref_oct_max(ref_oct); i++)
      ref_oct->children[i] = REF_EMPTY;
    for (i = 27 * orig; i < 27 * ref_oct_max(ref_oct); i++)
      ref_oct->nodes[i] = REF_EMPTY;
  }
  for (i = 0; i < 8; i++) {
    ref_oct_child(ref_oct, i, node) = ref_oct_n(ref_oct);
    (ref_oct_n(ref_oct))++;
  }
  return REF_SUCCESS;
}